

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

void __thiscall lzham::symbol_codec::reset(symbol_codec *this)

{
  this->m_mode = cNull;
  this->m_pDecode_buf = (uint8 *)0x0;
  this->m_pDecode_buf_next = (uint8 *)0x0;
  this->m_pDecode_buf_end = (uint8 *)0x0;
  this->m_decode_buf_size = 0;
  this->m_bit_buf = 0;
  this->m_bit_count = 0;
  this->m_total_model_updates = 0;
  this->m_total_bits_written = 0;
  this->m_arith_base = 0;
  this->m_arith_value = 0;
  this->m_arith_length = 0;
  this->m_arith_total_bits = 0;
  if ((this->m_output_buf).m_size != 0) {
    (this->m_output_buf).m_size = 0;
  }
  if ((this->m_arith_output_buf).m_size != 0) {
    (this->m_arith_output_buf).m_size = 0;
  }
  if ((this->m_output_syms).m_size != 0) {
    (this->m_output_syms).m_size = 0;
  }
  this->m_pDecode_need_bytes_func = (need_bytes_func_ptr)0x0;
  this->m_pDecode_private_data = (void *)0x0;
  this->m_pSaved_huff_model = (quasi_adaptive_huffman_data_model *)0x0;
  this->m_pSaved_model = (void *)0x0;
  this->m_saved_node_index = 0;
  return;
}

Assistant:

void symbol_codec::reset()
   {
      m_pDecode_buf = NULL;
      m_pDecode_buf_next = NULL;
      m_pDecode_buf_end = NULL;
      m_decode_buf_size = 0;

      m_bit_buf = 0;
      m_bit_count = 0;
      m_total_model_updates = 0;
      m_mode = cNull;
      m_total_bits_written = 0;

      m_arith_base = 0;
      m_arith_value = 0;
      m_arith_length = 0;
      m_arith_total_bits = 0;

      m_output_buf.try_resize(0);
      m_arith_output_buf.try_resize(0);
      m_output_syms.try_resize(0);

      m_pDecode_need_bytes_func = NULL;
      m_pDecode_private_data = NULL;
      m_pSaved_huff_model = NULL;
      m_pSaved_model = NULL;
      m_saved_node_index = 0;
   }